

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O0

int Doolittle8(uchar *mat,int *pivot,int n)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int j_1;
  uchar tmp_1;
  uchar mask_prepending;
  uchar mask_ik;
  int i;
  int c;
  uint mask_cpy;
  uint j;
  uchar tmp;
  int k;
  int local_3c;
  uint local_34;
  int local_30;
  uint local_28;
  uint local_20;
  int local_4;
  
  local_20 = 0;
  while( true ) {
    if ((int)(in_EDX - 1) <= (int)local_20) {
      *(uint *)(in_RSI + (long)(int)(in_EDX - 1) * 4) = in_EDX - 1;
      if ((*(byte *)(in_RDI + (int)(((int)in_EDX / 8) * (in_EDX - 1) + (int)in_EDX / 8 + -1)) & 1)
          == 0) {
        local_4 = -1;
      }
      else {
        local_4 = 0;
      }
      return local_4;
    }
    *(uint *)(in_RSI + (long)(int)local_20 * 4) = local_20;
    local_28 = local_20;
    while (local_28 = local_28 + 1, local_28 < in_EDX) {
      uVar2 = -((int)(uint)*(byte *)(in_RDI + (ulong)(((int)in_EDX / 8) * local_28 +
                                                     (int)local_20 / 8)) >>
                (7U - (char)((int)local_20 % 8) & 0x1f) & 1U &
               (uint)((((int)(uint)*(byte *)(in_RDI + (int)(((int)in_EDX / 8) * local_20 +
                                                           (int)local_20 / 8)) >>
                        (7U - (char)((int)local_20 % 8) & 0x1f) & 1U) != 0 ^ 0xffU) & 1));
      for (local_30 = 0; local_30 < (int)in_EDX / 8; local_30 = local_30 + 1) {
        bVar1 = *(byte *)(in_RDI + (ulong)(((int)in_EDX / 8) * local_28 + local_30));
        bVar3 = (byte)uVar2;
        *(byte *)(in_RDI + (ulong)(((int)in_EDX / 8) * local_28 + local_30)) =
             *(byte *)(in_RDI + (ulong)(((int)in_EDX / 8) * local_28 + local_30)) & (bVar3 ^ 0xff) |
             *(byte *)(in_RDI + (int)(((int)in_EDX / 8) * local_20 + local_30)) & bVar3;
        *(byte *)(in_RDI + (int)(((int)in_EDX / 8) * local_20 + local_30)) =
             *(byte *)(in_RDI + (int)(((int)in_EDX / 8) * local_20 + local_30)) & (bVar3 ^ 0xff) |
             bVar1 & bVar3;
      }
      *(uint *)(in_RSI + (long)(int)local_20 * 4) =
           local_28 & uVar2 | *(uint *)(in_RSI + (long)(int)local_20 * 4) & (uVar2 ^ 0xffffffff);
    }
    local_34 = local_20;
    if (((int)(uint)*(byte *)(in_RDI + ((int)(local_20 * in_EDX) / 8 + (int)local_20 / 8)) >>
         (7U - (char)((int)local_20 % 8) & 0x1f) & 1U) == 0) break;
    while (local_34 = local_34 + 1, (int)local_34 < (int)in_EDX) {
      bVar1 = 7U - (char)((int)local_20 % 8) & 0x1f;
      bVar3 = (char)(0 >> bVar1) -
              ((byte)((int)(uint)*(byte *)(in_RDI + ((int)(local_34 * in_EDX) / 8 +
                                                    (int)local_20 / 8)) >> bVar1) & 1);
      bVar4 = (char)(0x100 >> ((byte)((long)(int)(local_20 + 1) % 8) & 0x1f)) - 1;
      bVar1 = *(byte *)(in_RDI + (int)(((int)in_EDX / 8) * local_34 + (int)(local_20 + 1) / 8));
      lVar5 = (long)(int)(local_34 * ((int)in_EDX / 8) + (int)(local_20 + 1) / 8);
      *(byte *)(in_RDI + lVar5) =
           *(byte *)(in_RDI + lVar5) ^
           bVar3 & *(byte *)(in_RDI + (int)(local_20 * ((int)in_EDX / 8) + (int)(local_20 + 1) / 8))
      ;
      lVar5 = (long)(int)(((int)in_EDX / 8) * local_34 + (int)(local_20 + 1) / 8);
      *(byte *)(in_RDI + lVar5) = *(byte *)(in_RDI + lVar5) & bVar4;
      lVar5 = (long)(int)(((int)in_EDX / 8) * local_34 + (int)(local_20 + 1) / 8);
      *(byte *)(in_RDI + lVar5) = *(byte *)(in_RDI + lVar5) | bVar1 & (bVar4 ^ 0xff);
      for (local_3c = local_20 + (9 - (int)(local_20 + 1) % 8); local_3c < (int)in_EDX;
          local_3c = local_3c + 8) {
        lVar5 = (long)(int)(local_34 * ((int)in_EDX / 8) + local_3c / 8);
        *(byte *)(in_RDI + lVar5) =
             *(byte *)(in_RDI + lVar5) ^
             bVar3 & *(byte *)(in_RDI + (int)(local_20 * ((int)in_EDX / 8) + local_3c / 8));
      }
    }
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

int Doolittle8(unsigned char *mat, int *pivot, int n)
{

  /* LU pseudo code (inplace, without pivoting)
      // n-1 Iterationsschritte
      for k := 1 to n-1
       // Zeilen der Restmatrix werden durchlaufen
       for i := k+1 to n
         // Berechnung von L
         A(i,k) := A(i,k) / A(k,k) // Achtung: vorher Prüfung auf Nullwerte notwendig
         // Spalten der Restmatrix werden durchlaufen
         for j := k+1 to n
           // Berechnung von R
           A(i,j) := A(i,j) - A(i,k) * A(k,j)
   */

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    unsigned char tmp;
    for(unsigned int j = k+1; j < n; j++)
    {
      unsigned int mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/8; c++)
      {
        tmp = mat[(n/8)*j + c];
        mat[(n/8)*j + c] = (mat[(n/8)*j + c] & ~mask_cpy) | (mat[(n/8)*k + c] & mask_cpy);
        mat[(n/8)*k + c] = (mat[(n/8)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    // for i := k+1 to n
    //      for j := k+1 to n
    //          A(i,j) := A(i,j) - A(i,k) * A(k,j)
    //
    // Bitwise: A(i,j) := A(i,j) ^ A(i,k) & A(k,j)
    // idea: take element A(i,k). It's either 0 or 1. Expand to 8 bits. Multiply with A(k,j), ... A(k,j+7)
    // basically, bit A(i,k) decides whether row A(k) (starting from the k+1'th column) is added to the i+1'th, ..., n'th rows below
    // use a mask for constant time instead of if(bit==1)


    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      unsigned char mask_ik = 0x00 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;


      /*
       * now handle the rest of the row efficiently in byte-aligned byte-chunks
       */
      for(int j = k+1 + (8-((k+1)%8)); j < n; j += 8)
      {
        // A(i,j) = A(i,j) + mask_ik * A(k,j)
        // => XOR Bits A(i,j) ... A(i,j+7) with (mask_ik & (A(k,j), ... A(k,j+7))
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}